

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O2

int64_t __thiscall adios2::profiling::Timer::GetElapsedTime(Timer *this)

{
  long lVar1;
  long lVar2;
  allocator local_ab;
  allocator local_aa;
  allocator local_a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  string local_48;
  string local_28;
  
  if (this->m_InitialTimeSet == false) {
    std::__cxx11::string::string((string *)&local_28,"Toolkit",&local_a9);
    std::__cxx11::string::string((string *)&local_48,"profiling::iochrono::Timer",&local_aa);
    std::__cxx11::string::string((string *)&local_68,"GetElapsedTime",&local_ab);
    std::operator+(&local_a8,"Resume() in process ",&this->m_Process);
    std::operator+(&local_88,&local_a8," not called");
    helper::Throw<std::invalid_argument>(&local_28,&local_48,&local_68,&local_88,-1);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_28);
  }
  switch(this->m_TimeUnit) {
  case Microseconds:
    lVar1 = (this->m_ElapsedTime).__d.__r - (this->m_InitialTime).__d.__r;
    lVar2 = 1000;
    break;
  case Milliseconds:
    lVar1 = (this->m_ElapsedTime).__d.__r - (this->m_InitialTime).__d.__r;
    lVar2 = 1000000;
    break;
  case Seconds:
    lVar1 = (this->m_ElapsedTime).__d.__r - (this->m_InitialTime).__d.__r;
    lVar2 = 1000000000;
    break;
  case Minutes:
    lVar1 = (this->m_ElapsedTime).__d.__r - (this->m_InitialTime).__d.__r;
    lVar2 = 60000000000;
    break;
  case Hours:
    lVar1 = (this->m_ElapsedTime).__d.__r - (this->m_InitialTime).__d.__r;
    lVar2 = 3600000000000;
    break;
  default:
    return -1;
  }
  return lVar1 / lVar2;
}

Assistant:

int64_t Timer::GetElapsedTime()
{
    if (!m_InitialTimeSet)
    {
        helper::Throw<std::invalid_argument>("Toolkit", "profiling::iochrono::Timer",
                                             "GetElapsedTime",
                                             "Resume() in process " + m_Process + " not called");
    }

    int64_t time = -1;

    switch (m_TimeUnit)
    {

    case TimeUnit::Microseconds:
        time = std::chrono::duration_cast<std::chrono::microseconds>(m_ElapsedTime - m_InitialTime)
                   .count();
        break;

    case TimeUnit::Milliseconds:
        time = std::chrono::duration_cast<std::chrono::milliseconds>(m_ElapsedTime - m_InitialTime)
                   .count();
        break;

    case TimeUnit::Seconds:
        time =
            std::chrono::duration_cast<std::chrono::seconds>(m_ElapsedTime - m_InitialTime).count();
        break;

    case TimeUnit::Minutes:
        time =
            std::chrono::duration_cast<std::chrono::minutes>(m_ElapsedTime - m_InitialTime).count();
        break;

    case TimeUnit::Hours:
        time =
            std::chrono::duration_cast<std::chrono::hours>(m_ElapsedTime - m_InitialTime).count();
        break;
    }

    return time;
}